

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O2

bool __thiscall sf::Texture::create(Texture *this,uint width,uint height)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  ostream *poVar6;
  Uint64 UVar7;
  bool bVar8;
  GLint GVar9;
  Vector2u VVar10;
  TransientContextLock lock;
  TextureSaver save;
  GLuint texture;
  
  if (width == 0 || height == 0) {
    poVar6 = err();
    poVar6 = std::operator<<(poVar6,"Failed to create texture, invalid size (");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    poVar6 = std::operator<<(poVar6,"x");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    poVar6 = std::operator<<(poVar6,")");
    std::endl<char,std::char_traits<char>>(poVar6);
    bVar8 = false;
  }
  else {
    GlResource::TransientContextLock::TransientContextLock(&lock);
    priv::ensureExtensionsInit();
    uVar2 = getValidSize(width);
    uVar3 = getValidSize(height);
    uVar4 = getMaximumSize();
    bVar8 = uVar3 <= uVar4 && uVar2 <= uVar4;
    if (uVar3 <= uVar4 && uVar2 <= uVar4) {
      (this->m_size).x = width;
      (this->m_size).y = height;
      VVar10.y = uVar3;
      VVar10.x = uVar2;
      this->m_actualSize = VVar10;
      this->m_pixelsFlipped = false;
      this->m_fboAttachment = false;
      if (this->m_texture == 0) {
        (*sf_glad_glGenTextures)(1,&texture);
        this->m_texture = texture;
      }
      priv::TextureSaver::TextureSaver(&save);
      if (create(unsigned_int,unsigned_int)::textureEdgeClamp == '\0') {
        iVar5 = __cxa_guard_acquire(&create(unsigned_int,unsigned_int)::textureEdgeClamp);
        if (iVar5 != 0) {
          bVar1 = true;
          if (SF_GLAD_GL_VERSION_1_2 == 0 && SF_GLAD_GL_SGIS_texture_edge_clamp == 0) {
            bVar1 = Context::isExtensionAvailable("GL_EXT_texture_edge_clamp");
          }
          create::textureEdgeClamp = bVar1;
          __cxa_guard_release(&create(unsigned_int,unsigned_int)::textureEdgeClamp);
        }
      }
      if (((this->m_isRepeated == false) && (create::textureEdgeClamp == false)) &&
         (create(unsigned_int,unsigned_int)::warned == '\0')) {
        poVar6 = err();
        poVar6 = std::operator<<(poVar6,"OpenGL extension SGIS_texture_edge_clamp unavailable");
        std::endl<char,std::char_traits<char>>(poVar6);
        poVar6 = err();
        poVar6 = std::operator<<(poVar6,"Artifacts may occur along texture edges");
        std::endl<char,std::char_traits<char>>(poVar6);
        poVar6 = err();
        poVar6 = std::operator<<(poVar6,"Ensure that hardware acceleration is enabled if available")
        ;
        std::endl<char,std::char_traits<char>>(poVar6);
        create(unsigned_int,unsigned_int)::warned = '\x01';
      }
      if (create(unsigned_int,unsigned_int)::textureSrgb == '\0') {
        iVar5 = __cxa_guard_acquire(&create(unsigned_int,unsigned_int)::textureSrgb);
        if (iVar5 != 0) {
          create::textureSrgb = SF_GLAD_GL_EXT_texture_sRGB != 0;
          __cxa_guard_release(&create(unsigned_int,unsigned_int)::textureSrgb);
        }
      }
      if ((this->m_sRgb == true) && (create::textureSrgb == false)) {
        if (create(unsigned_int,unsigned_int)::warned == '\0') {
          poVar6 = err();
          poVar6 = std::operator<<(poVar6,"OpenGL extension EXT_texture_sRGB unavailable");
          std::endl<char,std::char_traits<char>>(poVar6);
          poVar6 = err();
          poVar6 = std::operator<<(poVar6,"Automatic sRGB to linear conversion disabled");
          std::endl<char,std::char_traits<char>>(poVar6);
          create(unsigned_int,unsigned_int)::warned = '\x01';
        }
        this->m_sRgb = false;
      }
      (*sf_glad_glBindTexture)(0xde1,this->m_texture);
      GVar9 = 0x1908;
      if (this->m_sRgb != false) {
        GVar9 = 0x8c43;
      }
      (*sf_glad_glTexImage2D)
                (0xde1,0,GVar9,(this->m_actualSize).x,(this->m_actualSize).y,0,0x1908,0x1401,
                 (void *)0x0);
      GVar9 = 0x2900;
      if ((create::textureEdgeClamp & 1U) != 0) {
        GVar9 = 0x812f;
      }
      if (this->m_isRepeated != false) {
        GVar9 = 0x2901;
      }
      (*sf_glad_glTexParameteri)(0xde1,0x2802,GVar9);
      GVar9 = 0x2900;
      if ((create::textureEdgeClamp & 1U) != 0) {
        GVar9 = 0x812f;
      }
      if (this->m_isRepeated != false) {
        GVar9 = 0x2901;
      }
      (*sf_glad_glTexParameteri)(0xde1,0x2803,GVar9);
      (*sf_glad_glTexParameteri)(0xde1,0x2800,this->m_isSmooth | 0x2600);
      (*sf_glad_glTexParameteri)(0xde1,0x2801,this->m_isSmooth | 0x2600);
      UVar7 = anon_unknown.dwarf_13ac4b::TextureImpl::getUniqueId();
      this->m_cacheId = UVar7;
      this->m_hasMipmap = false;
      priv::TextureSaver::~TextureSaver(&save);
    }
    else {
      poVar6 = err();
      poVar6 = std::operator<<(poVar6,"Failed to create texture, its internal size is too high ");
      poVar6 = std::operator<<(poVar6,"(");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      poVar6 = std::operator<<(poVar6,"x");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      poVar6 = std::operator<<(poVar6,", ");
      poVar6 = std::operator<<(poVar6,"maximum is ");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      poVar6 = std::operator<<(poVar6,"x");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      poVar6 = std::operator<<(poVar6,")");
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    GlResource::TransientContextLock::~TransientContextLock(&lock);
  }
  return bVar8;
}

Assistant:

bool Texture::create(unsigned int width, unsigned int height)
{
    // Check if texture parameters are valid before creating it
    if ((width == 0) || (height == 0))
    {
        err() << "Failed to create texture, invalid size (" << width << "x" << height << ")" << std::endl;
        return false;
    }

    TransientContextLock lock;

    // Make sure that extensions are initialized
    priv::ensureExtensionsInit();

    // Compute the internal texture dimensions depending on NPOT textures support
    Vector2u actualSize(getValidSize(width), getValidSize(height));

    // Check the maximum texture size
    unsigned int maxSize = getMaximumSize();
    if ((actualSize.x > maxSize) || (actualSize.y > maxSize))
    {
        err() << "Failed to create texture, its internal size is too high "
              << "(" << actualSize.x << "x" << actualSize.y << ", "
              << "maximum is " << maxSize << "x" << maxSize << ")"
              << std::endl;
        return false;
    }

    // All the validity checks passed, we can store the new texture settings
    m_size.x        = width;
    m_size.y        = height;
    m_actualSize    = actualSize;
    m_pixelsFlipped = false;
    m_fboAttachment = false;

    // Create the OpenGL texture if it doesn't exist yet
    if (!m_texture)
    {
        GLuint texture;
        glCheck(glGenTextures(1, &texture));
        m_texture = texture;
    }

    // Make sure that the current texture binding will be preserved
    priv::TextureSaver save;

    static bool textureEdgeClamp = GLEXT_texture_edge_clamp || GLEXT_GL_VERSION_1_2 || Context::isExtensionAvailable("GL_EXT_texture_edge_clamp");

    if (!m_isRepeated && !textureEdgeClamp)
    {
        static bool warned = false;

        if (!warned)
        {
            err() << "OpenGL extension SGIS_texture_edge_clamp unavailable" << std::endl;
            err() << "Artifacts may occur along texture edges" << std::endl;
            err() << "Ensure that hardware acceleration is enabled if available" << std::endl;

            warned = true;
        }
    }

    static bool textureSrgb = GLEXT_texture_sRGB;

    if (m_sRgb && !textureSrgb)
    {
        static bool warned = false;

        if (!warned)
        {
#ifndef SFML_OPENGL_ES
            err() << "OpenGL extension EXT_texture_sRGB unavailable" << std::endl;
#else
            err() << "OpenGL ES extension EXT_sRGB unavailable" << std::endl;
#endif
            err() << "Automatic sRGB to linear conversion disabled" << std::endl;

            warned = true;
        }

        m_sRgb = false;
    }

    // Initialize the texture
    glCheck(glBindTexture(GL_TEXTURE_2D, m_texture));
    glCheck(glTexImage2D(GL_TEXTURE_2D, 0, (m_sRgb ? GLEXT_GL_SRGB8_ALPHA8 : GL_RGBA), static_cast<GLsizei>(m_actualSize.x), static_cast<GLsizei>(m_actualSize.y), 0, GL_RGBA, GL_UNSIGNED_BYTE, NULL));
    glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, m_isRepeated ? GL_REPEAT : (textureEdgeClamp ? GLEXT_GL_CLAMP_TO_EDGE : GLEXT_GL_CLAMP)));
    glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, m_isRepeated ? GL_REPEAT : (textureEdgeClamp ? GLEXT_GL_CLAMP_TO_EDGE : GLEXT_GL_CLAMP)));
    glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST));
    glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST));
    m_cacheId = TextureImpl::getUniqueId();

    m_hasMipmap = false;

    return true;
}